

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O1

void __thiscall
Fifteen::moveNumericTile(Fifteen *this,size_t rowSrc,size_t colSrc,size_t rowDst,size_t colDst)

{
  pointer puVar1;
  __uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_> _Var2;
  int *piVar3;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *pvVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  QByteArrayView QVar8;
  key_type local_70;
  undefined4 uStack_6c;
  undefined8 uStack_68;
  undefined8 local_60;
  Controller local_58;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pvVar4 = TilesBoard::getTiles
                     ((this->tilesBoard)._M_t.
                      super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                      super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                      super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  Controller::getBoardAttributes(&local_58);
  uVar5 = (long)local_58.imageProvider._M_t.
                super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
                super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
                super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl * rowDst + colDst;
  puVar1 = (pvVar4->
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = uVar5;
  if ((uVar5 < (ulong)((long)(pvVar4->
                             super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) &&
     (uVar7 = (long)local_58.imageProvider._M_t.
                    super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
                    super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
                    super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl * rowSrc + colSrc,
     uVar7 < (ulong)((long)(pvVar4->
                           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar4->
                           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3))) {
    _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
    super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
         puVar1[uVar5]._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
         _M_t;
    QAbstractButton::text();
    QAbstractButton::setText
              ((QString *)
               _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
               super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
    piVar3 = (int *)CONCAT44(uStack_6c,local_70);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),2,8);
      }
    }
    uVar7 = rowDst * (long)local_58.imageProvider._M_t.
                           super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>
                           .super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl + colDst;
    puVar1 = (pvVar4->
             super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar7 < (ulong)((long)(pvVar4->
                              super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
      _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
      super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
           puVar1[uVar7]._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
           _M_t;
      Options::getTileColor();
      QWidget::setStyleSheet
                ((QString *)
                 _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>
                 .super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
      uVar7 = (long)local_58.imageProvider._M_t.
                    super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
                    super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
                    super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl * rowSrc + colSrc;
      puVar1 = (pvVar4->
               super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (uVar7 < (ulong)((long)(pvVar4->
                                super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
        _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
        super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
             puVar1[uVar7]._M_t.
             super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t;
        QVar8.m_data = (storage_type *)0x0;
        QVar8.m_size = (qsizetype)&local_70;
        QString::fromUtf8(QVar8);
        local_58.undoMoveService._M_t.
        super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
        super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
        super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl._4_4_ = uStack_6c;
        local_58.undoMoveService._M_t.
        super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
        super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
        super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl._0_4_ = local_70;
        uStack_40 = uStack_68;
        local_38 = local_60;
        QAbstractButton::setText
                  ((QString *)
                   _Var2._M_t.
                   super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                   super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
        if ((_Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>)
            local_58.undoMoveService._M_t.
            super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
            super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
            super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl != (UndoMove *)0x0) {
          LOCK();
          *(int *)local_58.undoMoveService._M_t.
                  super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                  super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                  super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl =
               *(int *)local_58.undoMoveService._M_t.
                       super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                       super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                       super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl + -1;
          UNLOCK();
          if (*(int *)local_58.undoMoveService._M_t.
                      super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                      super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                      super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl == 0) {
            QArrayData::deallocate
                      ((QArrayData *)
                       local_58.undoMoveService._M_t.
                       super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                       super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                       super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl,2,8);
          }
        }
        uVar7 = rowSrc * (long)local_58.imageProvider._M_t.
                               super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>
                               .super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl + colSrc;
        puVar1 = (pvVar4->
                 super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (uVar7 < (ulong)((long)(pvVar4->
                                  super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3))
        {
          _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
          super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
               puVar1[uVar7]._M_t.
               super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t;
          local_70 = EMPTY;
          std::
          map<TileColor,_const_QString,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_const_QString>_>_>
          ::at(&Maps::tileColorStyle,&local_70);
          QWidget::setStyleSheet
                    ((QString *)
                     _Var2._M_t.
                     super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                     super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
          return;
        }
      }
    }
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar7);
  if (local_58.undoMoveService._M_t.super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>.
      _M_t.super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
      super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>)0x0) {
    moveNumericTile();
  }
  _Unwind_Resume(uVar6);
}

Assistant:

void Fifteen::moveNumericTile( size_t rowSrc, size_t colSrc, size_t rowDst, size_t colDst )
{
    auto& tiles = tilesBoard->getTiles();
    const auto [ boardSize, _ ] = controller->getBoardAttributes();

    tiles.at( rowDst * boardSize + colDst )->setText( tiles.at( rowSrc * boardSize + colSrc )->text() );
    tiles.at( rowDst * boardSize + colDst )->setStyleSheet( Options::getTileColor() );
    tiles.at( rowSrc * boardSize + colSrc )->setText( "" );
    tiles.at( rowSrc * boardSize + colSrc )->setStyleSheet( Maps::tileColorStyle.at( TileColor::EMPTY ));
}